

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_debug.cpp
# Opt level: O0

void __thiscall FGLDebug::OutputMessageLog(FGLDebug *this)

{
  GLenum source;
  GLenum type;
  GLuint id;
  GLenum severity;
  GLsizei length;
  _func_GLuint_GLuint_GLsizei_GLenum_ptr_GLenum_ptr_GLuint_ptr_GLenum_ptr_GLsizei_ptr_GLchar_ptr
  *p_Var1;
  bool bVar2;
  uint amount;
  GLuint GVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  int *piVar8;
  char *pcVar9;
  uint local_9c;
  int local_98;
  GLuint i;
  GLsizei offset;
  GLuint numMessages;
  TArray<char,_char> messageLog;
  TArray<int,_int> lengths;
  TArray<unsigned_int,_unsigned_int> ids;
  TArray<unsigned_int,_unsigned_int> severities;
  undefined1 local_40 [8];
  TArray<unsigned_int,_unsigned_int> types;
  TArray<unsigned_int,_unsigned_int> sources;
  int messageLogSize;
  int maxMessages;
  GLint maxDebugMessageLength;
  FGLDebug *this_local;
  
  if (this->mCurrentLevel != 0) {
    messageLogSize = 0;
    _maxMessages = this;
    (*_ptrc_glGetIntegerv)(0x9143,&messageLogSize);
    amount = messageLogSize * 0x32;
    TArray<unsigned_int,_unsigned_int>::TArray((TArray<unsigned_int,_unsigned_int> *)&types.Most);
    TArray<unsigned_int,_unsigned_int>::TArray((TArray<unsigned_int,_unsigned_int> *)local_40);
    TArray<unsigned_int,_unsigned_int>::TArray((TArray<unsigned_int,_unsigned_int> *)&ids.Most);
    TArray<unsigned_int,_unsigned_int>::TArray((TArray<unsigned_int,_unsigned_int> *)&lengths.Most);
    TArray<int,_int>::TArray((TArray<int,_int> *)&messageLog.Most);
    TArray<char,_char>::TArray((TArray<char,_char> *)&offset);
    TArray<unsigned_int,_unsigned_int>::Resize
              ((TArray<unsigned_int,_unsigned_int> *)&types.Most,0x32);
    TArray<unsigned_int,_unsigned_int>::Resize((TArray<unsigned_int,_unsigned_int> *)local_40,0x32);
    TArray<unsigned_int,_unsigned_int>::Resize((TArray<unsigned_int,_unsigned_int> *)&ids.Most,0x32)
    ;
    TArray<unsigned_int,_unsigned_int>::Resize
              ((TArray<unsigned_int,_unsigned_int> *)&lengths.Most,0x32);
    TArray<int,_int>::Resize((TArray<int,_int> *)&messageLog.Most,0x32);
    TArray<char,_char>::Resize((TArray<char,_char> *)&offset,amount);
    while( true ) {
      p_Var1 = _ptrc_glGetDebugMessageLog;
      puVar4 = TArray<unsigned_int,_unsigned_int>::operator[]
                         ((TArray<unsigned_int,_unsigned_int> *)&types.Most,0);
      puVar5 = TArray<unsigned_int,_unsigned_int>::operator[]
                         ((TArray<unsigned_int,_unsigned_int> *)local_40,0);
      puVar6 = TArray<unsigned_int,_unsigned_int>::operator[]
                         ((TArray<unsigned_int,_unsigned_int> *)&lengths.Most,0);
      puVar7 = TArray<unsigned_int,_unsigned_int>::operator[]
                         ((TArray<unsigned_int,_unsigned_int> *)&ids.Most,0);
      piVar8 = TArray<int,_int>::operator[]((TArray<int,_int> *)&messageLog.Most,0);
      pcVar9 = TArray<char,_char>::operator[]((TArray<char,_char> *)&offset,0);
      GVar3 = (*p_Var1)(0x32,amount,puVar4,puVar5,puVar6,puVar7,piVar8,pcVar9);
      if (GVar3 == 0) break;
      local_98 = 0;
      for (local_9c = 0; local_9c < GVar3; local_9c = local_9c + 1) {
        puVar4 = TArray<unsigned_int,_unsigned_int>::operator[]
                           ((TArray<unsigned_int,_unsigned_int> *)&ids.Most,(ulong)local_9c);
        bVar2 = IsFilteredByDebugLevel(*puVar4);
        if (!bVar2) {
          puVar4 = TArray<unsigned_int,_unsigned_int>::operator[]
                             ((TArray<unsigned_int,_unsigned_int> *)&types.Most,(ulong)local_9c);
          source = *puVar4;
          puVar4 = TArray<unsigned_int,_unsigned_int>::operator[]
                             ((TArray<unsigned_int,_unsigned_int> *)local_40,(ulong)local_9c);
          type = *puVar4;
          puVar4 = TArray<unsigned_int,_unsigned_int>::operator[]
                             ((TArray<unsigned_int,_unsigned_int> *)&lengths.Most,(ulong)local_9c);
          id = *puVar4;
          puVar4 = TArray<unsigned_int,_unsigned_int>::operator[]
                             ((TArray<unsigned_int,_unsigned_int> *)&ids.Most,(ulong)local_9c);
          severity = *puVar4;
          piVar8 = TArray<int,_int>::operator[]
                             ((TArray<int,_int> *)&messageLog.Most,(ulong)local_9c);
          length = *piVar8;
          pcVar9 = TArray<char,_char>::operator[]((TArray<char,_char> *)&offset,(long)local_98);
          PrintMessage(source,type,id,severity,length,pcVar9);
        }
        piVar8 = TArray<int,_int>::operator[]((TArray<int,_int> *)&messageLog.Most,(ulong)local_9c);
        local_98 = *piVar8 + local_98;
      }
    }
    TArray<char,_char>::~TArray((TArray<char,_char> *)&offset);
    TArray<int,_int>::~TArray((TArray<int,_int> *)&messageLog.Most);
    TArray<unsigned_int,_unsigned_int>::~TArray((TArray<unsigned_int,_unsigned_int> *)&lengths.Most)
    ;
    TArray<unsigned_int,_unsigned_int>::~TArray((TArray<unsigned_int,_unsigned_int> *)&ids.Most);
    TArray<unsigned_int,_unsigned_int>::~TArray((TArray<unsigned_int,_unsigned_int> *)local_40);
    TArray<unsigned_int,_unsigned_int>::~TArray((TArray<unsigned_int,_unsigned_int> *)&types.Most);
  }
  return;
}

Assistant:

void FGLDebug::OutputMessageLog()
{
	if (mCurrentLevel <= 0)
		return;

	GLint maxDebugMessageLength = 0;
	glGetIntegerv(GL_MAX_DEBUG_MESSAGE_LENGTH, &maxDebugMessageLength);

	const int maxMessages = 50;
	const int messageLogSize = maxMessages * maxDebugMessageLength;

	TArray<GLenum> sources, types, severities;
	TArray<GLuint> ids;
	TArray<GLsizei> lengths;
	TArray<GLchar> messageLog;

	sources.Resize(maxMessages);
	types.Resize(maxMessages);
	severities.Resize(maxMessages);
	ids.Resize(maxMessages);
	lengths.Resize(maxMessages);
	messageLog.Resize(messageLogSize);

	while (true)
	{
		GLuint numMessages = glGetDebugMessageLog(maxMessages, messageLogSize, &sources[0], &types[0], &ids[0], &severities[0], &lengths[0], &messageLog[0]);
		if (numMessages <= 0) break;

		GLsizei offset = 0;
		for (GLuint i = 0; i < numMessages; i++)
		{
			if (!IsFilteredByDebugLevel(severities[i]))
				PrintMessage(sources[i], types[i], ids[i], severities[i], lengths[i], &messageLog[offset]);
			offset += lengths[i];
		}
	}
}